

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.h
# Opt level: O0

void __thiscall despot::History::Add(History *this,ACT_TYPE action,OBS_TYPE obs)

{
  OBS_TYPE local_20;
  OBS_TYPE obs_local;
  History *pHStack_10;
  ACT_TYPE action_local;
  History *this_local;
  
  local_20 = obs;
  obs_local._4_4_ = action;
  pHStack_10 = this;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)this,
             (value_type_conflict1 *)((long)&obs_local + 4));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x18),&local_20);
  return;
}

Assistant:

void Add(ACT_TYPE action, OBS_TYPE obs) {
		actions_.push_back(action);
		observations_.push_back(obs);
	}